

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_PNM_Image.cxx
# Opt level: O1

void __thiscall Fl_PNM_Image::Fl_PNM_Image(Fl_PNM_Image *this,char *name)

{
  char *pcVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  FILE *__stream;
  char *pcVar5;
  undefined4 extraout_var;
  long lVar6;
  uchar *puVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  int val;
  char line [1024];
  uint local_45c;
  char *local_458;
  int local_44c;
  ulong local_448;
  Fl_PNM_Image *local_440;
  char local_438 [1032];
  
  Fl_RGB_Image::Fl_RGB_Image(&this->super_Fl_RGB_Image,(uchar *)0x0,0,0,3,0);
  (this->super_Fl_RGB_Image).super_Fl_Image._vptr_Fl_Image =
       (_func_int **)&PTR__Fl_RGB_Image_0027bbf8;
  local_440 = this;
  __stream = (FILE *)fl_fopen(name,"rb");
  if (__stream != (FILE *)0x0) {
    pcVar5 = fgets(local_438,0x400,__stream);
    if (pcVar5 != (char *)0x0) {
      local_458 = pcVar5 + 1;
      iVar3 = atoi(local_458);
      local_448 = CONCAT44(extraout_var,iVar3);
      do {
        pcVar1 = pcVar5 + 1;
        pcVar5 = pcVar5 + 1;
      } while ((int)*pcVar1 - 0x30U < 10);
      if (iVar3 == 7) {
        pcVar5 = "";
      }
      local_458 = pcVar5;
      do {
        if ((this->super_Fl_RGB_Image).super_Fl_Image.w_ != 0) break;
        cVar2 = *local_458;
        if ((cVar2 == '#') || (cVar2 == '\0')) {
          local_458 = fgets(local_438,0x400,__stream);
        }
        else if ((int)cVar2 - 0x30U < 10) {
          lVar6 = strtol(local_458,&local_458,10);
          (this->super_Fl_RGB_Image).super_Fl_Image.w_ = (int)lVar6;
        }
        else {
          local_458 = local_458 + 1;
        }
      } while (local_458 != (char *)0x0);
      uVar9 = local_448;
      if (local_458 != (char *)0x0) {
        do {
          if ((this->super_Fl_RGB_Image).super_Fl_Image.h_ != 0) break;
          cVar2 = *local_458;
          if ((cVar2 == '#') || (cVar2 == '\0')) {
            local_458 = fgets(local_438,0x400,__stream);
          }
          else if ((int)cVar2 - 0x30U < 10) {
            lVar6 = strtol(local_458,&local_458,10);
            (this->super_Fl_RGB_Image).super_Fl_Image.h_ = (int)lVar6;
          }
          else {
            local_458 = local_458 + 1;
          }
        } while (local_458 != (char *)0x0);
      }
      uVar10 = 1;
      if (((int)uVar9 != 1) && ((int)uVar9 != 4)) {
        if (local_458 == (char *)0x0) {
          uVar10 = 0;
        }
        else {
          do {
            cVar2 = *local_458;
            if ((cVar2 == '#') || (cVar2 == '\0')) {
              local_458 = fgets(local_438,0x400,__stream);
LAB_0020f1d6:
              uVar10 = 0;
            }
            else {
              if (9 < (int)cVar2 - 0x30U) {
                local_458 = local_458 + 1;
                goto LAB_0020f1d6;
              }
              lVar6 = strtol(local_458,&local_458,10);
              uVar10 = (uint)lVar6;
            }
          } while ((local_458 != (char *)0x0) && (uVar10 == 0));
        }
      }
      uVar11 = (int)local_448 - 1;
      iVar3 = 3;
      if (uVar11 < 5) {
        iVar3 = *(int *)(&DAT_00243bb8 + (ulong)uVar11 * 4);
      }
      (this->super_Fl_RGB_Image).super_Fl_Image.d_ = iVar3;
      uVar9 = (long)iVar3 *
              (long)(this->super_Fl_RGB_Image).super_Fl_Image.h_ *
              (long)(this->super_Fl_RGB_Image).super_Fl_Image.w_;
      if (Fl_RGB_Image::max_size_ <= uVar9 && uVar9 - Fl_RGB_Image::max_size_ != 0) {
        (*Fl::warning)("PNM file \"%s\" is too large!\n",name);
        fclose(__stream);
        (this->super_Fl_RGB_Image).super_Fl_Image.w_ = 0;
        (this->super_Fl_RGB_Image).super_Fl_Image.h_ = 0;
        (this->super_Fl_RGB_Image).super_Fl_Image.d_ = 0;
        (this->super_Fl_RGB_Image).super_Fl_Image.ld_ = -3;
        return;
      }
      puVar7 = (uchar *)operator_new__(uVar9);
      (this->super_Fl_RGB_Image).array = puVar7;
      (this->super_Fl_RGB_Image).alloc_array = 1;
      if (0 < (this->super_Fl_RGB_Image).super_Fl_Image.h_) {
        local_44c = 0;
        local_448 = (ulong)uVar11;
        do {
          if ((uint)local_448 < 7) {
            iVar3 = (local_440->super_Fl_RGB_Image).super_Fl_Image.w_;
            iVar4 = (local_440->super_Fl_RGB_Image).super_Fl_Image.d_;
            puVar7 = (local_440->super_Fl_RGB_Image).array + iVar4 * iVar3 * local_44c;
            switch((long)&switchD_0020f314::switchdataD_00243b9c +
                   (long)(int)(&switchD_0020f314::switchdataD_00243b9c)[local_448]) {
            case 0x20f316:
              if ((int)uVar10 < 0x100) {
                fread(puVar7,(long)iVar3,(long)iVar4,__stream);
              }
              else if (0 < iVar4 * iVar3) {
                iVar3 = iVar4 * iVar3 + 1;
                do {
                  local_45c = getc(__stream);
                  local_45c = local_45c & 0xff;
                  uVar8 = local_45c << 8;
                  uVar11 = getc(__stream);
                  local_45c = uVar11 & 0xff | uVar8;
                  *puVar7 = (uchar)((local_45c * 0xff) / uVar10);
                  puVar7 = puVar7 + 1;
                  iVar3 = iVar3 + -1;
                } while (1 < iVar3);
              }
              break;
            case 0x20f38a:
              if (0 < iVar3) {
                iVar3 = iVar3 + 1;
                do {
                  iVar4 = __isoc99_fscanf(__stream,"%d",&local_45c);
                  if (iVar4 == 1) {
                    *puVar7 = (uchar)((int)(local_45c * 0xff) / (int)uVar10);
                    puVar7 = puVar7 + 1;
                  }
                  iVar4 = __isoc99_fscanf(__stream,"%d",&local_45c);
                  if (iVar4 == 1) {
                    *puVar7 = (uchar)((int)(local_45c * 0xff) / (int)uVar10);
                    puVar7 = puVar7 + 1;
                  }
                  iVar4 = __isoc99_fscanf(__stream,"%d",&local_45c);
                  if (iVar4 == 1) {
                    *puVar7 = (uchar)((int)(local_45c * 0xff) / (int)uVar10);
                    puVar7 = puVar7 + 1;
                  }
                  iVar3 = iVar3 + -1;
                } while (1 < iVar3);
              }
              break;
            case 0x20f434:
              uVar11 = getc(__stream);
              if (0 < iVar3) {
                iVar3 = iVar3 + 1;
                uVar8 = 0x80;
                do {
                  *puVar7 = -((uVar11 & 0xff & uVar8) == 0);
                  if (uVar8 < 2) {
                    uVar8 = 0x80;
                    if (iVar3 != 2) {
                      uVar11 = getc(__stream);
                    }
                  }
                  else {
                    uVar8 = uVar8 >> 1;
                  }
                  puVar7 = puVar7 + 1;
                  iVar3 = iVar3 + -1;
                } while (1 < iVar3);
              }
              break;
            case 0x20f491:
              if (0 < iVar3) {
                iVar3 = iVar3 + 1;
                do {
                  iVar4 = __isoc99_fscanf(__stream,"%d",&local_45c);
                  if (iVar4 == 1) {
                    *puVar7 = (char)local_45c + 0xff;
                    puVar7 = puVar7 + 1;
                  }
                  iVar3 = iVar3 + -1;
                } while (1 < iVar3);
              }
              break;
            case 0x20f4ce:
              if (0 < iVar3) {
                iVar3 = iVar3 + 1;
                do {
                  iVar4 = __isoc99_fscanf(__stream,"%d",&local_45c);
                  if (iVar4 == 1) {
                    *puVar7 = (uchar)((int)(local_45c * 0xff) / (int)uVar10);
                    puVar7 = puVar7 + 1;
                  }
                  iVar3 = iVar3 + -1;
                } while (1 < iVar3);
              }
              break;
            case 0x20f511:
              if (0 < iVar3) {
                iVar3 = iVar3 + 1;
                do {
                  uVar11 = getc(__stream);
                  *puVar7 = (uchar)((ulong)((uVar11 >> 5 & 7) * 0xff) * 0x24924925 >> 0x20);
                  puVar7[1] = (uchar)((ulong)((uVar11 >> 2 & 7) * 0xff) * 0x24924925 >> 0x20);
                  puVar7[2] = ((byte)uVar11 & 3) * 'U';
                  puVar7 = puVar7 + 3;
                  iVar3 = iVar3 + -1;
                } while (1 < iVar3);
              }
            }
          }
          local_44c = local_44c + 1;
        } while (local_44c < (local_440->super_Fl_RGB_Image).super_Fl_Image.h_);
      }
      fclose(__stream);
      return;
    }
    local_458 = pcVar5;
    fclose(__stream);
    (*Fl::error)("Early end-of-file in PNM file \"%s\"!",name);
  }
  (this->super_Fl_RGB_Image).super_Fl_Image.ld_ = -2;
  return;
}

Assistant:

Fl_PNM_Image::Fl_PNM_Image(const char *name)	// I - File to read
  : Fl_RGB_Image(0,0,0) {
  FILE		*fp;		// File pointer
  int		x, y;		// Looping vars
  char		line[1024],	// Input line
		*lineptr;	// Pointer in line
  uchar		*ptr,		// Pointer to pixel values
		byte,		// Byte from file
		bit;		// Bit in pixel
  int		format,		// Format of PNM file
		val,		// Pixel value
		maxval;		// Maximum pixel value


  if ((fp = fl_fopen(name, "rb")) == NULL) {
    ld(ERR_FILE_ACCESS);
    return;
  }

  //
  // Read the file header in the format:
  //
  //   Pformat
  //   # comment1
  //   # comment2
  //   ...
  //   # commentN
  //   width
  //   height
  //   max sample
  //

  lineptr = fgets(line, sizeof(line), fp);
  if (!lineptr) {
    fclose(fp);
    Fl::error("Early end-of-file in PNM file \"%s\"!", name);
    ld(ERR_FILE_ACCESS);
    return;
  }

  lineptr ++;

  format = atoi(lineptr);
  while (isdigit(*lineptr)) lineptr ++;

  if (format == 7) lineptr = (char *)"";

  while (lineptr != NULL && w() == 0) {
    if (*lineptr == '\0' || *lineptr == '#') {
      lineptr = fgets(line, sizeof(line), fp);
    } else if (isdigit(*lineptr)) {
      w(strtol(lineptr, &lineptr, 10));
    } else lineptr ++;
  }

  while (lineptr != NULL && h() == 0) {
    if (*lineptr == '\0' || *lineptr == '#') {
      lineptr = fgets(line, sizeof(line), fp);
    } else if (isdigit(*lineptr)) {
      h(strtol(lineptr, &lineptr, 10));
    } else lineptr ++;
  }

  if (format != 1 && format != 4) {
    maxval = 0;

    while (lineptr != NULL && maxval == 0) {
      if (*lineptr == '\0' || *lineptr == '#') {
	lineptr = fgets(line, sizeof(line), fp);
      } else if (isdigit(*lineptr)) {
	maxval = strtol(lineptr, &lineptr, 10);
      } else lineptr ++;
    }
  } else maxval = 1;

  // Allocate memory...
  if (format == 1 || format == 2 || format == 4 || format == 5) d(1);
  else d(3);

//  printf("%s = %dx%dx%d\n", name, w(), h(), d());

  if (((size_t)w()) * h() * d() > max_size() ) {
    Fl::warning("PNM file \"%s\" is too large!\n", name);
    fclose(fp);
    w(0); h(0); d(0); ld(ERR_FORMAT);
    return;
  }
  array       = new uchar[w() * h() * d()];
  alloc_array = 1;

  // Read the image file...
  for (y = 0; y < h(); y ++) {
    ptr = (uchar *)array + y * w() * d();

    switch (format) {
      case 1 :
        for (x = w(); x > 0; x --)
          if (fscanf(fp, "%d", &val) == 1) *ptr++ = (uchar)(255 * (1-val));
        break;
        
      case 2 :
          for (x = w(); x > 0; x --)
            if (fscanf(fp, "%d", &val) == 1) *ptr++ = (uchar)(255 * val / maxval);
          break;

      case 3 :
          for (x = w(); x > 0; x --) {
            if (fscanf(fp, "%d", &val) == 1) *ptr++ = (uchar)(255 * val / maxval);
            if (fscanf(fp, "%d", &val) == 1) *ptr++ = (uchar)(255 * val / maxval);
            if (fscanf(fp, "%d", &val) == 1) *ptr++ = (uchar)(255 * val / maxval);
          }
          break;

      case 4 :
        for (x = w(), byte = (uchar)getc(fp), bit = 128; x > 0; x --) {
          if ((byte & bit) == 0) *ptr++ = 255; // 0 bit for white pixel
          else *ptr++ = 0; // 1 bit for black pixel
          
          if (bit > 1) bit >>= 1;
          else {
            bit  = 128;
            if (x > 1) byte = (uchar)getc(fp);
          }
        }
        break;
          
      case 5 :
      case 6 :
        if (maxval < 256) {
          if (fread(ptr, w(), d(), fp)) { /* ignored */ }
        } else {
          for (x = d() * w(); x > 0; x --) {
            val = (uchar)getc(fp);
            val = (val<<8)|(uchar)getc(fp);
            *ptr++ = (255*val)/maxval;
          }
        }
        break;
        
      case 7 : /* XV 3:3:2 thumbnail format */
        for (x = w(); x > 0; x --) {
          byte = (uchar)getc(fp);
          
          *ptr++ = (uchar)(255 * ((byte >> 5) & 7) / 7);
          *ptr++ = (uchar)(255 * ((byte >> 2) & 7) / 7);
          *ptr++ = (uchar)(255 * (byte & 3) / 3);
        }
        break;
    }
  }

  fclose(fp);
}